

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O1

word If_Dec7Perform(word *t0,int fDerive)

{
  uint uVar1;
  long lVar2;
  int i;
  ulong uVar3;
  uchar *pTruth;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  word t [2];
  int Pla2Var [7];
  int Var2Pla [7];
  undefined8 local_a8;
  word local_a0;
  int local_8c;
  ulong local_88;
  undefined8 local_80;
  int local_78 [8];
  int local_58 [10];
  
  local_a8 = *t0;
  local_a0 = t0[1];
  lVar2 = 0;
  do {
    local_58[lVar2] = (int)lVar2;
    local_78[lVar2] = (int)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 7);
  local_88 = 0;
  local_8c = fDerive;
  do {
    uVar4 = (uint)local_88 + 1;
    uVar6 = uVar4;
    if ((uint)local_88 < 6) {
      do {
        uVar7 = uVar6 + 1;
        uVar1 = uVar7;
        if (uVar6 < 6) {
LAB_00412b87:
          uVar5 = 0;
          If_Dec7MoveTo(&local_a8,(int)local_88,0,local_78,local_58);
          If_Dec7MoveTo(&local_a8,uVar6,1,local_78,local_58);
          local_80 = (ulong)uVar1;
          If_Dec7MoveTo(&local_a8,uVar1,2,local_78,local_58);
          uVar3 = 1;
          do {
            if (*(byte *)((long)&local_a8 + uVar3) != (byte)local_a8) {
              if ((int)uVar5 == 0) {
                uVar5 = uVar3 & 0xffffffff;
              }
              else if (*(byte *)((long)&local_a8 + uVar3) !=
                       *(byte *)((long)&local_a8 + (long)(int)uVar5)) goto LAB_00412c03;
            }
            uVar3 = uVar3 + 1;
            if (uVar3 == 0x10) {
              if ((int)uVar5 == 0) {
                __assert_fail("iCof2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                              ,0xe3,"int If_Dec7CofCount3(word *)");
              }
              if (local_8c != 0) {
                lVar2 = 1;
                uVar4 = 0;
                uVar6 = (uint)(byte)local_a8;
                do {
                  uVar7 = 1 << ((byte)lVar2 & 0x1f);
                  uVar1 = (uint)*(byte *)((long)&local_a8 + lVar2);
                  if ((byte)local_a8 == *(byte *)((long)&local_a8 + lVar2)) {
                    uVar7 = 0;
                    uVar1 = uVar6;
                  }
                  uVar6 = uVar1;
                  uVar4 = uVar4 | uVar7;
                  lVar2 = lVar2 + 1;
                } while (lVar2 != 0x10);
                uVar3 = (ulong)(int)uVar4;
                lVar2 = 0x10;
                do {
                  uVar3 = uVar3 | (long)*(int *)((long)local_78 + lVar2 + -4) <<
                                  ((byte)lVar2 & 0x3f);
                  lVar2 = lVar2 + 4;
                } while (lVar2 != 0x20);
                uVar3 = uVar3 | (ulong)(uVar6 << 8 | (uint)(byte)local_a8) << 0x20;
                lVar2 = 0x30;
                do {
                  uVar3 = uVar3 | (long)*(int *)((long)&local_a8 + lVar2) << ((byte)lVar2 & 0x3f);
                  lVar2 = lVar2 + 4;
                } while (lVar2 != 0x3c);
                return uVar3 | 0x7000000000000000;
              }
              return 1;
            }
          } while( true );
        }
LAB_00412c1c:
        uVar6 = uVar7;
      } while (uVar7 != 7);
    }
    local_88 = (ulong)uVar4;
    if (uVar4 == 7) {
      return 0;
    }
  } while( true );
LAB_00412c03:
  uVar1 = (uint)local_80 + 1;
  if (5 < (uint)local_80) goto LAB_00412c1c;
  goto LAB_00412b87;
}

Assistant:

word If_Dec7Perform( word t0[2], int fDerive )
{
    word t[2] = {t0[0], t0[1]}; 
    int i, v, u, y, Pla2Var[7], Var2Pla[7];
    // start arrays
    for ( i = 0; i < 7; i++ )
    {
/*
        if ( i < 6 )
            assert( If_Dec6HasVar( t[0], i ) || If_Dec6HasVar( t[1], i ) );
        else
            assert( t[0] != t[1] );
*/
        Pla2Var[i] = Var2Pla[i] = i;
    }
    // generate permutations
    for ( v = 0;   v < 7; v++ )
    for ( u = v+1; u < 7; u++ )
    for ( y = u+1; y < 7; y++ )
    {
        If_Dec7MoveTo( t, v, 0, Pla2Var, Var2Pla );
        If_Dec7MoveTo( t, u, 1, Pla2Var, Var2Pla );
        If_Dec7MoveTo( t, y, 2, Pla2Var, Var2Pla );
//        If_DecVerifyPerm( Pla2Var, Var2Pla );
        if ( If_Dec7CofCount3( t ) == 2 )
        {
            return !fDerive ? 1 : If_Dec7DeriveDisjoint( t, Pla2Var, Var2Pla );
        }
    }
    return 0;
}